

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.h
# Opt level: O0

void __thiscall CRNFRCommand::CRNFRCommand(CRNFRCommand *this)

{
  CRNFRCommand *this_local;
  
  CCommand::CCommand(&this->super_CCommand);
  (this->super_CCommand)._vptr_CCommand = (_func_int **)&PTR_MatchCommand_0014f8d0;
  std::__cxx11::string::operator=((string *)&(this->super_CCommand).m_Command,"RNFR");
  return;
}

Assistant:

CRNFRCommand(){m_Command = "RNFR";}